

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_3650dd::HandleReadSymlinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  undefined8 name;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  cmMakefile *this;
  string local_a8;
  Status local_88;
  undefined1 local_80 [8];
  string result;
  string *outputVariable;
  string *filename;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar3 == 3) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    result.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,2);
    std::__cxx11::string::string((string *)local_80);
    local_88 = cmsys::SystemTools::ReadSymlink(pvVar4,(string *)local_80);
    bVar2 = cmsys::Status::operator_cast_to_bool(&local_88);
    pcVar1 = local_20;
    bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
    if (bVar2) {
      cmStrCat<char_const(&)[57],std::__cxx11::string_const&>
                (&local_a8,
                 (char (*) [57])"READ_SYMLINK requested of path that is not a symlink:\n  ",pvVar4);
      cmExecutionStatus::SetError(pcVar1,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      this = cmExecutionStatus::GetMakefile(local_20);
      name = result.field_2._8_8_;
      value = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
      cmMakefile::AddDefinition(this,(string *)name,value);
    }
    args_local._7_1_ = !bVar2;
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[42]>
              (&local_40,pvVar4,(char (*) [42])0xfa78db);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    args_local._7_1_ = 0;
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleReadSymlinkCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires a file name and output variable"));
    return false;
  }

  const std::string& filename = args[1];
  const std::string& outputVariable = args[2];

  std::string result;
  if (!cmSystemTools::ReadSymlink(filename, result)) {
    status.SetError(cmStrCat(
      "READ_SYMLINK requested of path that is not a symlink:\n  ", filename));
    return false;
  }

  status.GetMakefile().AddDefinition(outputVariable, result);

  return true;
}